

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void dump_CSTK(int before)

{
  LispPTR LVar1;
  DLword *local_18;
  DLword *ptr;
  int before_local;
  
  for (local_18 = MachineState.csp + -(long)before; local_18 != MachineState.csp;
      local_18 = local_18 + 1) {
    LVar1 = LAddrFromNative(local_18);
    printf("\n%x : %x ",(ulong)LVar1,(ulong)*(ushort *)((ulong)local_18 ^ 2));
  }
  LVar1 = LAddrFromNative(MachineState.csp);
  printf("\nCurrentSTKP : %x  ",(ulong)LVar1);
  printf("\ncontents :  %x ",(ulong)*(uint *)(MachineState.csp + -1));
  return;
}

Assistant:

void dump_CSTK(int before) {
  DLword *ptr;
  ptr = CurrentStackPTR - before;
  while (ptr != CurrentStackPTR) {
    printf("\n%x : %x ", LAddrFromNative(ptr), GETWORD(ptr));
    ptr++;
  }
  printf("\nCurrentSTKP : %x  ", LAddrFromNative(CurrentStackPTR));
  printf("\ncontents :  %x ", *((LispPTR *)(CurrentStackPTR - 1)));
}